

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectbox.hpp
# Opt level: O3

int __thiscall obx::BoxTypeless::remove(BoxTypeless *this,char *__filename)

{
  int err;
  uint64_t result;
  OBX_id_array cIds;
  
  err = obx_box_remove_many(this->cBox_);
  if (err == 0) {
    return 0;
  }
  internal::throwLastError(err,(char *)0x0);
}

Assistant:

uint64_t BoxTypeless::remove(const std::vector<obx_id>& ids) {
    uint64_t result = 0;
    const OBX_id_array cIds = internal::cIdArrayRef(ids);
    internal::checkErrOrThrow(obx_box_remove_many(cBox_, &cIds, &result));
    return result;
}